

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_client.cc
# Opt level: O1

bool bssl::parse_server_hello_tls13
               (SSL_HANDSHAKE *hs,ParsedServerHello *out,uint8_t *out_alert,SSLMessage *msg)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  InplaceVector<unsigned_char,_32UL> *__s2;
  uint16_t uVar5;
  
  bVar1 = ssl_parse_server_hello(out,out_alert,msg);
  if (!bVar1) {
    return false;
  }
  iVar2 = SSL_is_dtls(hs->ssl);
  iVar3 = SSL_is_dtls(hs->ssl);
  __s2 = (InplaceVector<unsigned_char,_32UL> *)0x0;
  sVar4 = 0;
  if (iVar3 == 0) {
    sVar4 = (size_t)(hs->session_id).size_;
    __s2 = &hs->session_id;
  }
  uVar5 = 0xfefd;
  if (iVar2 == 0) {
    uVar5 = 0x303;
  }
  if ((((uVar5 == out->legacy_version) && (out->compression_method == '\0')) &&
      (__n = (out->session_id).len, __n == sVar4)) &&
     (((__n == 0 || (iVar2 = bcmp((out->session_id).data,__s2,__n), iVar2 == 0)) &&
      ((out->extensions).len != 0)))) {
    return true;
  }
  ERR_put_error(0x10,0,0x89,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                ,0x80);
  *out_alert = '2';
  return false;
}

Assistant:

static bool parse_server_hello_tls13(const SSL_HANDSHAKE *hs,
                                     ParsedServerHello *out, uint8_t *out_alert,
                                     const SSLMessage &msg) {
  if (!ssl_parse_server_hello(out, out_alert, msg)) {
    return false;
  }
  uint16_t expected_version =
      SSL_is_dtls(hs->ssl) ? DTLS1_2_VERSION : TLS1_2_VERSION;
  // DTLS 1.3 disables "compatibility mode" (RFC 8446, appendix D.4). When
  // disabled, servers MUST NOT echo the legacy_session_id (RFC 9147, section
  // 5). The client could have sent a session ID indicating its willingness to
  // resume a DTLS 1.2 session, so just checking that the session IDs match is
  // incorrect.
  Span<const uint8_t> expected_session_id =
      SSL_is_dtls(hs->ssl) ? Span<const uint8_t>() : Span(hs->session_id);

  // RFC 8446 fixes some legacy values. Check them.
  if (out->legacy_version != expected_version ||  //
      out->compression_method != 0 ||
      Span<const uint8_t>(out->session_id) != expected_session_id ||
      CBS_len(&out->extensions) == 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }
  return true;
}